

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O1

SVInt * __thiscall slang::SVInt::assignSlowCase(SVInt *this,SVInt *rhs)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  uint64_t *puVar4;
  uint uVar5;
  
  if (this == rhs) {
    return this;
  }
  uVar5 = (rhs->super_SVIntStorage).bitWidth;
  bVar1 = (rhs->super_SVIntStorage).unknownFlag;
  if (uVar5 < 0x41 && (bVar1 & 1) == 0) {
    puVar4 = (this->super_SVIntStorage).field_0.pVal;
    if (puVar4 != (uint64_t *)0x0) {
      operator_delete__(puVar4);
    }
    (this->super_SVIntStorage).field_0 = (rhs->super_SVIntStorage).field_0;
    goto LAB_00201679;
  }
  uVar3 = (this->super_SVIntStorage).bitWidth;
  bVar2 = (this->super_SVIntStorage).unknownFlag;
  if (uVar3 < 0x41 && (bVar2 & 1U) == 0) {
LAB_00201631:
    puVar4 = (uint64_t *)operator_new__((ulong)(((uVar5 + 0x3f >> 6) << (bVar1 & 0x1f)) << 3));
    (this->super_SVIntStorage).field_0.pVal = puVar4;
  }
  else if ((uVar3 + 0x3f >> 6) << (bVar2 & 0x1fU) != (uVar5 + 0x3f >> 6) << (bVar1 & 0x1f)) {
    puVar4 = (this->super_SVIntStorage).field_0.pVal;
    if (puVar4 != (uint64_t *)0x0) {
      operator_delete__(puVar4);
    }
    uVar5 = (rhs->super_SVIntStorage).bitWidth;
    bVar1 = (rhs->super_SVIntStorage).unknownFlag;
    goto LAB_00201631;
  }
  memcpy((this->super_SVIntStorage).field_0.pVal,(rhs->super_SVIntStorage).field_0.pVal,
         (ulong)((((rhs->super_SVIntStorage).bitWidth + 0x3f >> 6) <<
                 ((rhs->super_SVIntStorage).unknownFlag & 0x1fU)) << 3));
LAB_00201679:
  (this->super_SVIntStorage).bitWidth = (rhs->super_SVIntStorage).bitWidth;
  (this->super_SVIntStorage).signFlag = (rhs->super_SVIntStorage).signFlag;
  (this->super_SVIntStorage).unknownFlag = (rhs->super_SVIntStorage).unknownFlag;
  return this;
}

Assistant:

SVInt& SVInt::assignSlowCase(const SVInt& rhs) {
    if (this == &rhs)
        return *this;

    if (rhs.isSingleWord()) {
        delete[] pVal;
        val = rhs.val;
    }
    else {
        if (isSingleWord()) {
            pVal = new uint64_t[rhs.getNumWords()];
        }
        else if (getNumWords() != rhs.getNumWords()) {
            delete[] pVal;
            pVal = new uint64_t[rhs.getNumWords()];
        }
        memcpy(pVal, rhs.pVal, rhs.getNumWords() * WORD_SIZE);
    }
    bitWidth = rhs.bitWidth;
    signFlag = rhs.signFlag;
    unknownFlag = rhs.unknownFlag;
    return *this;
}